

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O1

int archive_read_extract2(archive *_a,archive_entry *entry,archive *ad)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  la_int64_t lVar5;
  archive_read_extract *paVar6;
  la_ssize_t lVar7;
  char *pcVar8;
  void *buff;
  int64_t offset;
  size_t local_48;
  void *local_40;
  la_int64_t local_38;
  
  if (*(int *)&_a[1].vtable != 0) {
    archive_write_disk_set_skip_file
              (ad,*(la_int64_t *)&_a[1].archive_format,(la_int64_t)_a[1].archive_format_name);
  }
  iVar1 = archive_write_header(ad,entry);
  if (iVar1 != 0) {
    iVar4 = -0x14;
    if (-0x14 < iVar1) {
      iVar4 = iVar1;
    }
    archive_copy_error(_a,ad);
    goto LAB_0022ce46;
  }
  wVar3 = archive_entry_size_is_set(entry);
  if (wVar3 == L'\0') {
LAB_0022cea4:
    paVar6 = __archive_read_get_extract((archive_read *)_a);
    if (paVar6 == (archive_read_extract *)0x0) {
      iVar4 = -0x1e;
      goto LAB_0022ce46;
    }
    while( true ) {
      iVar4 = archive_read_data_block(_a,&local_40,&local_48,&local_38);
      if (iVar4 != 0) break;
      lVar7 = archive_write_data_block(ad,local_40,local_48,local_38);
      iVar1 = (int)lVar7;
      if (iVar1 < 0) {
        iVar4 = -0x14;
        if (-0x14 < iVar1) {
          iVar4 = iVar1;
        }
        iVar1 = archive_errno(ad);
        pcVar8 = archive_error_string(ad);
        archive_set_error(_a,iVar1,"%s",pcVar8);
        goto LAB_0022ce46;
      }
      if (paVar6->extract_progress != (_func_void_void_ptr *)0x0) {
        (*paVar6->extract_progress)(paVar6->extract_progress_user_data);
      }
    }
    if (iVar4 != 1) goto LAB_0022ce46;
  }
  else {
    lVar5 = archive_entry_size(entry);
    if (0 < lVar5) goto LAB_0022cea4;
  }
  iVar4 = 0;
LAB_0022ce46:
  iVar1 = archive_write_finish_entry(ad);
  if (iVar4 == 0 && iVar1 != 0) {
    archive_copy_error(_a,ad);
  }
  iVar2 = -0x14;
  if (-0x14 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar4 <= iVar2) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int
archive_read_extract2(struct archive *_a, struct archive_entry *entry,
    struct archive *ad)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r, r2;

	/* Set up for this particular entry. */
	if (a->skip_file_set)
		archive_write_disk_set_skip_file(ad,
		    a->skip_file_dev, a->skip_file_ino);
	r = archive_write_header(ad, entry);
	if (r < ARCHIVE_WARN)
		r = ARCHIVE_WARN;
	if (r != ARCHIVE_OK)
		/* If _write_header failed, copy the error. */
 		archive_copy_error(&a->archive, ad);
	else if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) > 0)
		/* Otherwise, pour data into the entry. */
		r = copy_data(_a, ad);
	r2 = archive_write_finish_entry(ad);
	if (r2 < ARCHIVE_WARN)
		r2 = ARCHIVE_WARN;
	/* Use the first message. */
	if (r2 != ARCHIVE_OK && r == ARCHIVE_OK)
		archive_copy_error(&a->archive, ad);
	/* Use the worst error return. */
	if (r2 < r)
		r = r2;
	return (r);
}